

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

void Abc_SclReadSurfaceGenlib(SC_Surface *p)

{
  int iVar1;
  Vec_Flt_t *p_00;
  Vec_Int_t *p_01;
  int local_28;
  int local_24;
  int j;
  int i;
  Vec_Int_t *vVecI;
  Vec_Flt_t *vVec;
  SC_Surface *p_local;
  
  Vec_FltPush(&p->vIndex0,0.0);
  iVar1 = Scl_Flt2Int(0.0);
  Vec_IntPush(&p->vIndex0I,iVar1);
  Vec_FltPush(&p->vIndex1,0.0);
  iVar1 = Scl_Flt2Int(0.0);
  Vec_IntPush(&p->vIndex1I,iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_FltSize(&p->vIndex0);
    if (iVar1 <= local_24) break;
    iVar1 = Vec_FltSize(&p->vIndex1);
    p_00 = Vec_FltAlloc(iVar1);
    Vec_PtrPush(&p->vData,p_00);
    iVar1 = Vec_FltSize(&p->vIndex1);
    p_01 = Vec_IntAlloc(iVar1);
    Vec_PtrPush(&p->vDataI,p_01);
    local_28 = 0;
    while( true ) {
      iVar1 = Vec_FltSize(&p->vIndex1);
      if (iVar1 <= local_28) break;
      Vec_FltPush(p_00,1.0);
      iVar1 = Scl_Flt2Int(1.0);
      Vec_IntPush(p_01,iVar1);
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reading library from file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Abc_SclReadSurfaceGenlib( SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    Vec_FltPush( &p->vIndex0, 0 );
    Vec_IntPush( &p->vIndex0I, Scl_Flt2Int(0) );

    Vec_FltPush( &p->vIndex1, 0 );
    Vec_IntPush( &p->vIndex1I, Scl_Flt2Int(0) );

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            Vec_FltPush( vVec, 1 );
            Vec_IntPush( vVecI, Scl_Flt2Int(1) );
        }
    }
}